

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O2

ze_result_t
zeGetKernelExpProcAddrTable(ze_api_version_t version,ze_kernel_exp_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  ze_pfnKernelSchedulingHintExp_t p_Var3;
  ze_result_t zVar4;
  code *pcVar5;
  long lVar6;
  long lVar7;
  long extraout_RDX;
  iterator __begin1;
  undefined8 *puVar8;
  ze_kernel_exp_dditable_t dditable;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  ze_pfnKernelGetBinaryExp_t local_38;
  
  puVar8 = *(undefined8 **)(loader::context + 0x15e0);
  puVar1 = *(undefined8 **)(loader::context + 0x15e8);
  if (puVar1 == puVar8) {
LAB_001edc29:
    zVar4 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    if (pDdiTable == (ze_kernel_exp_dditable_t *)0x0) {
      return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    if (*(int *)(loader::context + 0x15c0) < (int)version) {
      return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    }
    zVar4 = ZE_RESULT_SUCCESS;
    for (; puVar8 != puVar1; puVar8 = puVar8 + 0x1b3) {
      if ((*(int *)(puVar8 + 1) == 0) &&
         (pcVar5 = (code *)dlsym(*puVar8,"zeGetKernelExpProcAddrTable"), pcVar5 != (code *)0x0)) {
        zVar4 = (*pcVar5)(version,puVar8 + 0xb9);
      }
    }
    if (zVar4 != ZE_RESULT_SUCCESS) {
      return zVar4;
    }
    lVar2 = *(long *)(loader::context + 0x15e0);
    lVar6 = *(long *)(loader::context + 0x15e8) - lVar2;
    lVar7 = lVar6 % 0xd98;
    if (((ulong)(lVar6 / 0xd98) < 2) && (*(char *)(loader::context + 0x1629) != '\x01')) {
      pDdiTable->pfnGetBinaryExp = *(ze_pfnKernelGetBinaryExp_t *)(lVar2 + 0x5d8);
      p_Var3 = *(ze_pfnKernelSchedulingHintExp_t *)(lVar2 + 0x5d0);
      pDdiTable->pfnSetGlobalOffsetExp = *(ze_pfnKernelSetGlobalOffsetExp_t *)(lVar2 + 0x5c8);
      pDdiTable->pfnSchedulingHintExp = p_Var3;
    }
    else {
      pDdiTable->pfnSetGlobalOffsetExp = loader::zeKernelSetGlobalOffsetExp;
      pDdiTable->pfnGetBinaryExp = loader::zeKernelGetBinaryExp;
      pDdiTable->pfnSchedulingHintExp = loader::zeKernelSchedulingHintExp;
    }
    if (*(long *)(loader::context + 0x1618) != 0) {
      pcVar5 = (code *)dlsym(*(long *)(loader::context + 0x1618),"zeGetKernelExpProcAddrTable",lVar7
                            );
      if (pcVar5 == (code *)0x0) goto LAB_001edc29;
      zVar4 = (*pcVar5)(version,pDdiTable);
      lVar7 = extraout_RDX;
      if (zVar4 != ZE_RESULT_SUCCESS) {
        return zVar4;
      }
    }
    if (*(long *)(loader::context + 0x1620) == 0) {
      zVar4 = ZE_RESULT_SUCCESS;
    }
    else {
      pcVar5 = (code *)dlsym(*(long *)(loader::context + 0x1620),"zeGetKernelExpProcAddrTable",lVar7
                            );
      zVar4 = ZE_RESULT_ERROR_UNINITIALIZED;
      if (pcVar5 != (code *)0x0) {
        local_38 = pDdiTable->pfnGetBinaryExp;
        local_48 = *(undefined4 *)&pDdiTable->pfnSetGlobalOffsetExp;
        uStack_44 = *(undefined4 *)((long)&pDdiTable->pfnSetGlobalOffsetExp + 4);
        uStack_40 = *(undefined4 *)&pDdiTable->pfnSchedulingHintExp;
        uStack_3c = *(undefined4 *)((long)&pDdiTable->pfnSchedulingHintExp + 4);
        zVar4 = (*pcVar5)(version,&local_48);
        lVar2 = loader::context;
        *(undefined4 *)(loader::context + 0x1c10) = local_48;
        *(undefined4 *)(lVar2 + 0x1c14) = uStack_44;
        *(undefined4 *)(lVar2 + 0x1c18) = uStack_40;
        *(undefined4 *)(lVar2 + 0x1c1c) = uStack_3c;
        *(ze_pfnKernelGetBinaryExp_t *)(lVar2 + 0x1c20) = local_38;
        if (*(char *)(lVar2 + 0x1652) == '\x01') {
          zVar4 = (*pcVar5)(version,pDdiTable);
        }
      }
    }
  }
  return zVar4;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetKernelExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_kernel_exp_dditable_t* pDdiTable             ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<ze_pfnGetKernelExpProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zeGetKernelExpProcAddrTable") );
        if(!getTable) 
            continue; 
        result = getTable( version, &drv.dditable.ze.KernelExp);
    }


    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnSetGlobalOffsetExp                       = loader::zeKernelSetGlobalOffsetExp;
            pDdiTable->pfnGetBinaryExp                             = loader::zeKernelGetBinaryExp;
            pDdiTable->pfnSchedulingHintExp                        = loader::zeKernelSchedulingHintExp;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.ze.KernelExp;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetKernelExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zeGetKernelExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    // If the API tracing layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->tracingLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetKernelExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->tracingLayer, "zeGetKernelExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        ze_kernel_exp_dditable_t dditable;
        memcpy(&dditable, pDdiTable, sizeof(ze_kernel_exp_dditable_t));
        result = getTable( version, &dditable );
        loader::context->tracing_dditable.ze.KernelExp = dditable;
        if ( loader::context->tracingLayerEnabled ) {
            result = getTable( version, pDdiTable );
        }
    }

    return result;
}